

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O3

adt_ary_t * adt_ary_make(void **ppElem,int32_t s32Len,_func_void_void_ptr *pDestructor)

{
  void **ppvVar1;
  adt_ary_t *self;
  long lVar2;
  
  if ((ppElem == (void **)0x0 || s32Len == 0x7fffffff) ||
     (self = (adt_ary_t *)malloc(0x30), self == (adt_ary_t *)0x0)) {
    self = (adt_ary_t *)0x0;
  }
  else {
    self->ppAlloc = (void **)0x0;
    self->pFirst = (void **)0x0;
    self->s32AllocLen = 0;
    self->s32CurLen = 0;
    self->pDestructor = pDestructor;
    self->pFillElem = (void *)0x0;
    self->destructorEnable = true;
    adt_ary_extend(self,s32Len);
    ppvVar1 = self->pFirst;
    if (ppvVar1 == (void **)0x0) {
      __assert_fail("ppDest != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ary.c"
                    ,0x3c,"adt_ary_t *adt_ary_make(void **, int32_t, void (*)(void *))");
    }
    if (0 < s32Len) {
      lVar2 = 0;
      do {
        ppvVar1[lVar2] = ppElem[lVar2];
        lVar2 = lVar2 + 1;
      } while (s32Len != (int)lVar2);
    }
  }
  return self;
}

Assistant:

adt_ary_t*	adt_ary_make(void** ppElem, int32_t s32Len,void (*pDestructor)(void*)){
	adt_ary_t *self;
	int32_t s32i;
	void **ppDest,**ppSrc;

	if(s32Len>= INT32_MAX){
		//array length too long
		return (adt_ary_t*) 0;
	}

	if(ppElem == 0){
		return (adt_ary_t*) 0;
	}

	self = adt_ary_new(pDestructor);
	if(self==(adt_ary_t*)0){
		return (adt_ary_t*)0;
	}
	adt_ary_extend(self,s32Len);
	ppDest=self->pFirst;
	assert(ppDest != 0);
	ppSrc=ppElem;
	for(s32i=0;s32i<s32Len;s32i++){
		*(ppDest++) = *(ppSrc++);
	}
	return self;
}